

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBooleanStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::BooleanStateQueryVerifiers::GetBooleanVerifier::verifyBoolean
          (GetBooleanVerifier *this,TestContext *testCtx,GLenum name,bool reference)

{
  GLenum pname;
  bool bVar1;
  qpTestResult qVar2;
  uchar *puVar3;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  char *local_1c0 [3];
  MessageBuilder local_1a8;
  uchar local_21;
  StateQueryMemoryWriteGuard<unsigned_char> local_20;
  byte local_1d;
  GLenum GStack_1c;
  GLboolean expectedGLState;
  StateQueryMemoryWriteGuard<unsigned_char> state;
  bool reference_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetBooleanVerifier *this_local;
  
  local_1d = reference;
  GStack_1c = name;
  _state = testCtx;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::StateQueryMemoryWriteGuard
            (&local_20);
  pname = GStack_1c;
  puVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::operator&
                     (&local_20);
  glu::CallLogWrapper::glGetBooleanv(&(this->super_StateVerifier).super_CallLogWrapper,pname,puVar3)
  ;
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::verifyValidity
                    (&local_20,_state);
  if (bVar1) {
    local_21 = (local_1d & 1) != 0;
    puVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_unsigned_char_
                       ((StateQueryMemoryWriteGuard *)&local_20);
    if (*puVar3 != local_21) {
      this_00 = tcu::TestContext::getLog(_state);
      tcu::TestLog::operator<<(&local_1a8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [20])"// ERROR: expected ");
      local_1c0[0] = "GL_FALSE";
      if ((local_1d & 1) != 0) {
        local_1c0[0] = "GL_TRUE";
      }
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_1c0);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1a8);
      qVar2 = tcu::TestContext::getTestResult(_state);
      if (qVar2 == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(_state,QP_TEST_RESULT_FAIL,"Got invalid boolean value");
      }
    }
  }
  return;
}

Assistant:

void GetBooleanVerifier::verifyBoolean (tcu::TestContext& testCtx, GLenum name, bool reference)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLboolean> state;
	glGetBooleanv(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	const GLboolean expectedGLState = reference ? GL_TRUE : GL_FALSE;

	if (state != expectedGLState)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected " << (reference ? "GL_TRUE" : "GL_FALSE") << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
	}
}